

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvalidConstraint * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidConstraint,slang::ast::Constraint_const*&>
          (BumpAllocator *this,Constraint **args)

{
  InvalidConstraint *this_00;
  Constraint **args_local;
  BumpAllocator *this_local;
  
  this_00 = (InvalidConstraint *)allocate(this,0x18,8);
  ast::InvalidConstraint::InvalidConstraint(this_00,*args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }